

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall
QMenuBarPrivate::copyActionToPlatformMenu(QMenuBarPrivate *this,QAction *action,QPlatformMenu *menu)

{
  undefined1 uVar1;
  long lVar2;
  long *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long in_RSI;
  long in_FS_OFFSET;
  quintptr tag;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (**(code **)(*in_RDX + 0x88))();
  if (lVar2 != in_RSI) {
    (**(code **)(*in_RDX + 0x80))(in_RDX,in_RSI);
  }
  QAction::text();
  (**(code **)(*in_RDX + 0x90))(in_RDX,local_20);
  QString::~QString((QString *)0x65e065);
  uVar1 = QAction::isVisible();
  (**(code **)(*in_RDX + 0xb0))(in_RDX,uVar1,extraout_RDX,uVar1);
  uVar1 = QAction::isEnabled();
  (**(code **)(*in_RDX + 0xa0))(in_RDX,uVar1,extraout_RDX_00,uVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBarPrivate::copyActionToPlatformMenu(const QAction *action, QPlatformMenu *menu)
{
    const auto tag = reinterpret_cast<quintptr>(action);
    if (menu->tag() != tag)
        menu->setTag(tag);
    menu->setText(action->text());
    menu->setVisible(action->isVisible());
    menu->setEnabled(action->isEnabled());
}